

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxautopr.hpp
# Opt level: O2

SPxId __thiscall soplex::SPxAutoPR<double>::selectEnter(SPxAutoPR<double> *this)

{
  bool bVar1;
  int iVar2;
  SPxOut *pSVar3;
  undefined4 extraout_var;
  SPxId SVar4;
  Verbosity old_verbosity;
  int extraout_var_00;
  
  bVar1 = setActivePricer(this,ENTER);
  if (((bVar1) &&
      (pSVar3 = ((this->super_SPxPricer<double>).thesolver)->spxout, pSVar3 != (SPxOut *)0x0)) &&
     (2 < (int)pSVar3->m_verbosity)) {
    old_verbosity = pSVar3->m_verbosity;
    (*pSVar3->_vptr_SPxOut[2])();
    pSVar3 = soplex::operator<<(((this->super_SPxPricer<double>).thesolver)->spxout,
                                " --- active pricer: ");
    iVar2 = (**this->activepricer->_vptr_SPxPricer)();
    pSVar3 = soplex::operator<<(pSVar3,(char *)CONCAT44(extraout_var,iVar2));
    std::endl<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]);
    pSVar3 = ((this->super_SPxPricer<double>).thesolver)->spxout;
    (*pSVar3->_vptr_SPxOut[2])(pSVar3,&old_verbosity);
  }
  SVar4.super_DataKey.info = (*this->activepricer->_vptr_SPxPricer[0xb])();
  SVar4.super_DataKey.idx = extraout_var_00;
  return (SPxId)SVar4.super_DataKey;
}

Assistant:

SPxId SPxAutoPR<R>::selectEnter()
{
   if(setActivePricer(SPxSolverBase<R>::ENTER))
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- active pricer: " << activepricer->getName() << std::endl;)

      return activepricer->selectEnter();
}